

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order.cpp
# Opt level: O2

void __thiscall Order_product1_Test::Order_product1_Test(Order_product1_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00229a98;
  return;
}

Assistant:

TEST(Order, product1)
{
    auto const b = symbol("b");;
    auto const c = symbol("c");
    auto const d = symbol("d");
    EXPECT_EQ(toString(b * d), "(* b d)");
    EXPECT_EQ(toString(b * c * d), "(* b c d)");

    auto const e1 = c * d;
    auto const e2 = b * c * d;
    EXPECT_EQ(toString(e1), "(* c d)");
    EXPECT_EQ(toString(e2), "(* b c d)");
    EXPECT_TRUE(less(e1, e2));
}